

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

UINT GetConsoleOutputCP(void)

{
  if (PAL_InitializeChakraCoreCalled) {
    GetACP();
    if (PAL_InitializeChakraCoreCalled != false) {
      return 0xfde9;
    }
  }
  abort();
}

Assistant:

UINT
PALAPI
GetConsoleOutputCP(
       VOID)
{
    UINT nRet = 0;
    PERF_ENTRY(GetConsoleOutputCP);
    ENTRY("GetConsoleOutputCP()\n");
    nRet = GetACP();
    LOGEXIT("GetConsoleOutputCP returns UINT %d \n", nRet );
    PERF_EXIT(GetConsoleOutputCP);
    return nRet;
}